

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

ListSchema capnp::ListSchema::of(Reader elementType,Schema context)

{
  Type TVar1;
  Type TVar2;
  Type TVar3;
  Reader elementType_00;
  Which primitiveType;
  ulong uVar4;
  anon_union_8_2_eba6ea51_for_Type_5 aVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  Type TVar10;
  ListSchema LVar11;
  undefined8 unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  Which *in_stack_00000018;
  WirePointer *in_stack_00000020;
  uint in_stack_00000028;
  short in_stack_0000002c;
  undefined2 in_stack_0000002e;
  int in_stack_00000030;
  Fault f;
  Schema in_stack_ffffffffffffff88;
  Schema local_70;
  PointerReader local_68;
  StructReader local_40;
  
  if (in_stack_00000028 < 0x10) {
    primitiveType = VOID;
  }
  else {
    primitiveType = *in_stack_00000018;
    if (DATA < primitiveType) {
      switch(primitiveType) {
      case LIST:
        bVar7 = in_stack_0000002c == 0;
        local_68.pointer = in_stack_00000020;
        if (bVar7) {
          local_68.pointer = (WirePointer *)0x0;
        }
        local_68.nestingLimit = 0x7fffffff;
        if (!bVar7) {
          local_68.nestingLimit = in_stack_00000030;
        }
        uVar8 = 0;
        uVar9 = 0;
        local_68.capTable._0_4_ = 0;
        local_68.capTable._4_4_ = 0;
        if (!bVar7) {
          uVar8 = in_stack_00000008;
          uVar9 = in_stack_0000000c;
          local_68.capTable._0_4_ = in_stack_00000010;
          local_68.capTable._4_4_ = in_stack_00000014;
        }
        local_68.segment = (SegmentReader *)CONCAT44(uVar9,uVar8);
        capnp::_::PointerReader::getStruct(&local_40,&local_68,(word *)0x0);
        elementType_00._reader.capTable._0_4_ = in_stack_00000008;
        elementType_00._reader.segment = (SegmentReader *)unaff_retaddr;
        elementType_00._reader.capTable._4_4_ = in_stack_0000000c;
        elementType_00._reader.data._0_4_ = in_stack_00000010;
        elementType_00._reader.data._4_4_ = in_stack_00000014;
        elementType_00._reader.pointers = (WirePointer *)in_stack_00000018;
        elementType_00._reader._32_8_ = in_stack_00000020;
        elementType_00._reader.nestingLimit = in_stack_00000028;
        elementType_00._reader._44_2_ = in_stack_0000002c;
        elementType_00._reader._46_2_ = in_stack_0000002e;
        LVar11 = of(elementType_00,in_stack_ffffffffffffff88);
        uVar4 = LVar11.elementType._0_8_ & 0xffffffffff00ffff |
                (ulong)(LVar11.elementType._0_4_ + 0x10000U & 0xff0000);
        TVar3.field_4.schema = LVar11.elementType.field_4.schema;
        TVar3.baseType = (short)uVar4;
        TVar3.listDepth = (char)(uVar4 >> 0x10);
        TVar3.isImplicitParam = (bool)(char)(uVar4 >> 0x18);
        TVar3.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)(uVar4 >> 0x20);
        TVar3._6_2_ = (short)(uVar4 >> 0x30);
        return (ListSchema)TVar3;
      case ENUM:
        if (in_stack_00000028 < 0x80) {
          uVar6 = VOID;
        }
        else {
          uVar6 = *(undefined8 *)(in_stack_00000018 + 4);
        }
        break;
      case STRUCT:
        if (in_stack_00000028 < 0x80) {
          uVar6 = VOID;
        }
        else {
          uVar6 = *(undefined8 *)(in_stack_00000018 + 4);
        }
        local_68.segment = (SegmentReader *)Schema::getDependency(&local_70,uVar6,0);
        aVar5 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asStruct((Schema *)&local_68);
        TVar1.field_4 =
             (anon_union_8_2_eba6ea51_for_Type_5)(anon_union_8_2_eba6ea51_for_Type_5)aVar5.schema;
        TVar1.baseType = STRUCT;
        TVar1.listDepth = '\0';
        TVar1.isImplicitParam = false;
        TVar1.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
        TVar1._6_2_ = 0;
        return (ListSchema)TVar1;
      case INTERFACE:
        if (in_stack_00000028 < 0x80) {
          uVar6 = VOID;
        }
        else {
          uVar6 = *(undefined8 *)(in_stack_00000018 + 4);
        }
        local_68.segment = (SegmentReader *)Schema::getDependency(&local_70,uVar6,0);
        aVar5 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asInterface((Schema *)&local_68);
        TVar10.field_4 =
             (anon_union_8_2_eba6ea51_for_Type_5)(anon_union_8_2_eba6ea51_for_Type_5)aVar5.schema;
        TVar10.baseType = INTERFACE;
        TVar10.listDepth = '\0';
        TVar10.isImplicitParam = false;
        TVar10.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
        TVar10._6_2_ = 0;
        return (ListSchema)TVar10;
      case ANY_POINTER:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                  ((Fault *)&local_68,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
                   ,0x306,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
                   (char (*) [32])"List(AnyPointer) not supported.");
        kj::_::Debug::Fault::fatal((Fault *)&local_68);
      default:
        return (ListSchema)(Type)ZEXT216(primitiveType);
      }
      local_68.segment = (SegmentReader *)Schema::getDependency(&local_70,uVar6,0);
      aVar5 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asEnum((Schema *)&local_68);
      TVar2.field_4 =
           (anon_union_8_2_eba6ea51_for_Type_5)(anon_union_8_2_eba6ea51_for_Type_5)aVar5.schema;
      TVar2.baseType = ENUM;
      TVar2.listDepth = '\0';
      TVar2.isImplicitParam = false;
      TVar2.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
      TVar2._6_2_ = 0;
      return (ListSchema)TVar2;
    }
  }
  TVar10 = (Type)of(primitiveType);
  return (ListSchema)TVar10;
}

Assistant:

ListSchema ListSchema::of(schema::Type::Reader elementType, Schema context) {
  // This method is deprecated because it can only be implemented in terms of other deprecated
  // methods. Temporarily disable warnings for those other deprecated methods.
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wdeprecated-declarations"

  switch (elementType.which()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      return of(elementType.which());

    case schema::Type::STRUCT:
      return of(context.getDependency(elementType.getStruct().getTypeId()).asStruct());

    case schema::Type::ENUM:
      return of(context.getDependency(elementType.getEnum().getTypeId()).asEnum());

    case schema::Type::INTERFACE:
      return of(context.getDependency(elementType.getInterface().getTypeId()).asInterface());

    case schema::Type::LIST:
      return of(of(elementType.getList().getElementType(), context));

    case schema::Type::ANY_POINTER:
      KJ_FAIL_REQUIRE("List(AnyPointer) not supported.");
      return ListSchema();
  }

  // Unknown type is acceptable.
  return ListSchema(elementType.which());
#pragma GCC diagnostic pop
}